

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>::on_chr
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  uint uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  
  uVar1 = this->abs_value;
  pbVar2 = (this->out).container;
  if (pbVar2->capacity_ < pbVar2->size_ + 1) {
    (**pbVar2->_vptr_buffer)(pbVar2);
  }
  sVar3 = pbVar2->size_;
  pbVar2->size_ = sVar3 + 1;
  pbVar2->ptr_[sVar3] = (char)uVar1;
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }